

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O3

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  int iVar2;
  explore_eval *peVar3;
  option_group_definition *this;
  base_learner *l;
  multi_learner *base;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar4;
  long lVar5;
  undefined **ppuVar6;
  label_parser *plVar7;
  byte bVar8;
  bool explore_eval_option;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  bool local_261;
  explore_eval *local_260;
  vw *local_258;
  _func_int ***local_250;
  _func_int **local_248;
  _func_int **local_240 [2];
  long local_230;
  _func_int ***local_228;
  _func_int **local_220;
  _func_int **local_218 [2];
  option_group_definition local_208;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [112];
  bool local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  string local_110;
  string local_f0;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar8 = 0;
  local_258 = all;
  peVar3 = calloc_or_throw<EXPLORE_EVAL::explore_eval>(1);
  (peVar3->known_cost).cost = 0.0;
  (peVar3->known_cost).action = 0;
  (peVar3->known_cost).probability = 0.0;
  (peVar3->known_cost).partial_prediction = 0.0;
  peVar3->all = (vw *)0x0;
  peVar3->offset = 0;
  (peVar3->action_label).costs._begin = (cb_class *)0x0;
  (peVar3->action_label).costs._end = (cb_class *)0x0;
  (peVar3->action_label).costs.end_array = (cb_class *)0x0;
  (peVar3->action_label).costs.erase_count = 0;
  (peVar3->empty_label).costs._begin = (cb_class *)0x0;
  (peVar3->empty_label).costs._end = (cb_class *)0x0;
  (peVar3->empty_label).costs.end_array = (cb_class *)0x0;
  (peVar3->empty_label).costs.erase_count = 0;
  peVar3->example_counter = 0;
  peVar3->update_count = 0;
  peVar3->violations = 0;
  peVar3->multiplier = 0.0;
  peVar3->fixed_multiplier = false;
  *(undefined3 *)&peVar3->field_0x7d = 0;
  local_261 = false;
  local_1b0._0_8_ = (_func_int **)0x12;
  local_260 = peVar3;
  local_250 = local_240;
  local_250 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)local_1b0);
  local_240[0] = (_func_int **)local_1b0._0_8_;
  *(undefined4 *)local_250 = 0x6c707845;
  builtin_strncpy((char *)((long)local_250 + 4),"ore ",4);
  *(undefined4 *)(local_250 + 1) = 0x6c617665;
  builtin_strncpy((char *)((long)local_250 + 0xc),"uati",4);
  *(undefined2 *)(local_250 + 2) = 0x6e6f;
  local_248 = (_func_int **)local_1b0._0_8_;
  *(char *)((long)local_250 + local_1b0._0_8_) = '\0';
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_250,(char *)(local_1b0._0_8_ + (long)local_250));
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  local_f0.field_2._M_allocated_capacity = 0x5f65726f6c707865;
  local_f0.field_2._8_4_ = 0x6c617665;
  local_f0._M_string_length = 0xc;
  local_f0.field_2._M_local_buf[0xc] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_1b0,&local_f0,&local_261)
  ;
  local_140 = true;
  local_228 = local_218;
  local_d0._0_8_ = (_func_int **)0x22;
  local_228 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)local_d0);
  local_218[0] = (_func_int **)local_d0._0_8_;
  local_228[2] = (_func_int **)0x6461206c6176655f;
  local_228[3] = (_func_int **)0x6963696c6f702066;
  *local_228 = (_func_int **)0x657461756c617645;
  local_228[1] = (_func_int **)0x65726f6c70786520;
  *(undefined2 *)(local_228 + 4) = 0x7365;
  local_220 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_228 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1b0 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_208,(typed_option<bool> *)local_1b0);
  local_110.field_2._M_allocated_capacity = 0x696c7069746c756d;
  local_110.field_2._8_2_ = 0x7265;
  local_110._M_string_length = 10;
  local_110.field_2._M_local_buf[10] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_110,&peVar3->multiplier);
  local_230 = 0x3f;
  local_1d0 = local_1c0;
  local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_230);
  local_1c0[0] = local_230;
  builtin_strncpy((char *)((long)local_1d0 + 0x2f),"obabilit",8);
  builtin_strncpy((char *)((long)local_1d0 + 0x37),"ies <= 1",8);
  local_1d0[4] = 0x6173206e6f697463;
  local_1d0[5] = 0x6f727020656c706d;
  local_1d0[2] = 0x20656b616d206f74;
  local_1d0[3] = 0x656a6572206c6c61;
  *local_1d0 = 0x696c7069746c754d;
  local_1d0[1] = 0x2064657375207265;
  local_1c8 = local_230;
  *(char *)((long)local_1d0 + local_230) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (this,(typed_option<float> *)local_d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_d0._0_8_ = &PTR__typed_option_002d7e20;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  local_1b0._0_8_ = &PTR__typed_option_002d5f10;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  if (local_261 == false) {
    plVar4 = (learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
    peVar3 = local_260;
  }
  else {
    local_260->all = local_258;
    pp_Var1 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._16_6_ = 0x7069746c756d;
    local_1b0._22_2_ = 0x696c;
    local_1b0._24_2_ = 0x7265;
    local_1b0._8_8_ = (pointer)0xa;
    local_1b0._26_4_ = local_1b0._26_4_ & 0xffffff00;
    local_1b0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options,local_1b0);
    if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      peVar3->multiplier = 1.0;
    }
    else {
      local_260->fixed_multiplier = true;
    }
    local_1b0._16_6_ = 0x7078655f6263;
    local_1b0._22_2_ = 0x6f6c;
    local_1b0._24_2_ = 0x6572;
    local_1b0._26_4_ = 0x6664615f;
    local_1b0._8_8_ = (pointer)0xe;
    local_1b0[0x1e] = '\0';
    local_1b0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      local_1b0._16_6_ = 0x7078655f6263;
      local_1b0._22_2_ = 0x6f6c;
      local_1b0._24_2_ = 0x6572;
      local_1b0._26_4_ = 0x6664615f;
      local_1b0._8_8_ = (pointer)0xe;
      local_1b0[0x1e] = '\0';
      local_d0._8_8_ = (pointer)0x0;
      local_d0[0x10] = 0;
      local_1b0._0_8_ = pp_Var1;
      local_d0._0_8_ = local_d0 + 0x10;
      (*options->_vptr_options_i[5])(options,local_1b0,local_d0);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
        operator_delete((void *)local_1b0._0_8_);
      }
    }
    local_258->delete_prediction = (_func_void_void_ptr *)0x0;
    l = setup_base(options,local_258);
    base = LEARNER::as_multiline<char,char>(l);
    ppuVar6 = &CB::cb_label;
    plVar7 = &local_258->p->lp;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      plVar7->default_label = (_func_void_void_ptr *)*ppuVar6;
      ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
      plVar7 = (label_parser *)((long)plVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    local_258->label_type = cb;
    plVar4 = LEARNER::
             learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (local_260,base,EXPLORE_EVAL::do_actual_learning<true>,
                        EXPLORE_EVAL::do_actual_learning<false>,1,action_probs);
    *(undefined8 *)(plVar4 + 0x58) = *(undefined8 *)(plVar4 + 0x18);
    *(code **)(plVar4 + 0x68) = EXPLORE_EVAL::finish_multiline_example;
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = EXPLORE_EVAL::finish;
    peVar3 = (explore_eval *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  if (peVar3 != (explore_eval *)0x0) {
    free(peVar3);
  }
  return (base_learner *)plVar4;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}